

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

double __thiscall soplex::SPxSolverBase<double>::nonbasicValue(SPxSolverBase<double> *this)

{
  uint uVar1;
  Status SVar2;
  pointer pdVar3;
  pointer pdVar4;
  ulong uVar5;
  long lVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  if (this->m_nonbasicValueUpToDate == true) {
    return this->m_nonbasicValue;
  }
  if (this->theRep == COLUMN) {
    uVar1 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
            thenum;
    if (this->theType == LEAVE) {
      if ((int)uVar1 < 1) {
        dVar11 = 0.0;
        dVar12 = 0.0;
      }
      else {
        pdVar3 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar5 = (ulong)uVar1 + 1;
        dVar12 = 0.0;
        dVar11 = 0.0;
        do {
          SVar2 = (this->super_SPxBasisBase<double>).thedesc.colstat.data[uVar5 - 2];
          pdVar7 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar10 = pdVar3;
          if (((SVar2 == P_FIXED) ||
              (pdVar7 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
              pdVar10 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start, SVar2 == P_ON_UPPER)) ||
             (pdVar7 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start, pdVar10 = pdVar3,
             SVar2 == P_ON_LOWER)) {
            dVar13 = dVar11 + pdVar7[uVar5 - 2] * pdVar10[uVar5 - 2];
            dVar12 = dVar12 + (pdVar7[uVar5 - 2] * pdVar10[uVar5 - 2] - (dVar13 - dVar11)) +
                              (dVar11 - (dVar13 - (dVar13 - dVar11)));
            dVar11 = dVar13;
          }
          uVar5 = uVar5 - 1;
        } while (1 < uVar5);
      }
      lVar6 = (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                    super_SVSetBase<double>.set.thenum;
      if (0 < lVar6) {
        pdVar3 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar5 = lVar6 + 1;
        do {
          SVar2 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data[uVar5 - 2];
          pdVar7 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar10 = pdVar3;
          if (((SVar2 == P_FIXED) ||
              (pdVar7 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
              pdVar10 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start, SVar2 == P_ON_UPPER)) ||
             (pdVar7 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start, pdVar10 = pdVar3,
             SVar2 == P_ON_LOWER)) {
            dVar13 = dVar11 + pdVar7[uVar5 - 2] * pdVar10[uVar5 - 2];
            dVar12 = dVar12 + (pdVar7[uVar5 - 2] * pdVar10[uVar5 - 2] - (dVar13 - dVar11)) +
                              (dVar11 - (dVar13 - (dVar13 - dVar11)));
            dVar11 = dVar13;
          }
          uVar5 = uVar5 - 1;
        } while (1 < uVar5);
      }
    }
    else {
      if ((int)uVar1 < 1) {
        dVar11 = 0.0;
        dVar12 = 0.0;
      }
      else {
        pdVar3 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = (ulong)uVar1 + 1;
        dVar12 = 0.0;
        dVar11 = 0.0;
        do {
          SVar2 = (this->super_SPxBasisBase<double>).thedesc.colstat.data[uVar5 - 2];
          pdVar7 = pdVar3;
          if (((SVar2 == P_FIXED) ||
              (pdVar7 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start, SVar2 == P_ON_UPPER)) ||
             (pdVar7 = pdVar3, SVar2 == P_ON_LOWER)) {
            dVar13 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar5 - 2] * pdVar7[uVar5 - 2];
            dVar14 = dVar11 + dVar13;
            dVar12 = dVar12 + (dVar13 - (dVar14 - dVar11)) + (dVar11 - (dVar14 - (dVar14 - dVar11)))
            ;
            dVar11 = dVar14;
          }
          uVar5 = uVar5 - 1;
        } while (1 < uVar5);
      }
      lVar6 = (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                    super_SVSetBase<double>.set.thenum;
      if (0 < lVar6) {
        pdVar3 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = lVar6 + 1;
        do {
          SVar2 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data[uVar5 - 2];
          pdVar7 = pdVar3;
          if (((SVar2 == P_FIXED) ||
              (pdVar7 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start, SVar2 == P_ON_UPPER)) ||
             (pdVar7 = pdVar3, SVar2 == P_ON_LOWER)) {
            dVar13 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar5 - 2] * pdVar7[uVar5 - 2];
            dVar14 = dVar11 + dVar13;
            dVar12 = dVar12 + (dVar13 - (dVar14 - dVar11)) + (dVar11 - (dVar14 - (dVar14 - dVar11)))
            ;
            dVar11 = dVar14;
          }
          uVar5 = uVar5 - 1;
        } while (1 < uVar5);
      }
    }
  }
  else {
    lVar6 = (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>
                  .set.thenum;
    if (lVar6 < 1) {
      dVar11 = 0.0;
      dVar12 = 0.0;
    }
    else {
      pdVar3 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar10 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar4 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = lVar6 + 1;
      dVar12 = 0.0;
      dVar11 = 0.0;
      do {
        SVar2 = (this->super_SPxBasisBase<double>).thedesc.colstat.data[uVar5 - 2];
        pdVar8 = pdVar4;
        pdVar9 = pdVar7;
        if (SVar2 == D_ON_UPPER) {
LAB_001f6cc1:
          dVar13 = dVar11 + pdVar8[uVar5 - 2] * pdVar9[uVar5 - 2];
          dVar12 = dVar12 + (pdVar8[uVar5 - 2] * pdVar9[uVar5 - 2] - (dVar13 - dVar11)) +
                            (dVar11 - (dVar13 - (dVar13 - dVar11)));
          dVar11 = dVar13;
        }
        else {
          if (SVar2 == D_ON_BOTH) {
            dVar13 = pdVar3[uVar5 - 2] * pdVar10[uVar5 - 2];
            dVar14 = dVar11 + dVar13;
            dVar12 = dVar12 + (dVar13 - (dVar14 - dVar11)) + (dVar11 - (dVar14 - (dVar14 - dVar11)))
            ;
            dVar11 = dVar14;
            goto LAB_001f6cc1;
          }
          pdVar8 = pdVar3;
          pdVar9 = pdVar10;
          if (SVar2 == D_ON_LOWER) goto LAB_001f6cc1;
        }
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
    }
    lVar6 = (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>
                  .set.thenum;
    if (0 < lVar6) {
      pdVar3 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pdVar10 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar4 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = lVar6 + 1;
      do {
        SVar2 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data[uVar5 - 2];
        pdVar8 = pdVar4;
        pdVar9 = pdVar7;
        if (SVar2 == D_ON_UPPER) {
LAB_001f6e42:
          dVar13 = dVar11 + pdVar8[uVar5 - 2] * pdVar9[uVar5 - 2];
          dVar12 = dVar12 + (pdVar8[uVar5 - 2] * pdVar9[uVar5 - 2] - (dVar13 - dVar11)) +
                            (dVar11 - (dVar13 - (dVar13 - dVar11)));
          dVar11 = dVar13;
        }
        else {
          if (SVar2 == D_ON_BOTH) {
            dVar13 = pdVar3[uVar5 - 2] * pdVar10[uVar5 - 2];
            dVar14 = dVar11 + dVar13;
            dVar12 = dVar12 + (dVar13 - (dVar14 - dVar11)) + (dVar11 - (dVar14 - (dVar14 - dVar11)))
            ;
            dVar11 = dVar14;
            goto LAB_001f6e42;
          }
          pdVar8 = pdVar3;
          pdVar9 = pdVar10;
          if (SVar2 == D_ON_LOWER) goto LAB_001f6e42;
        }
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
    }
  }
  this->m_nonbasicValue = dVar11 + dVar12;
  this->m_nonbasicValueUpToDate = true;
  return dVar11 + dVar12;
}

Assistant:

R SPxSolverBase<R>::nonbasicValue()
   {
      int i;
      StableSum<R> val;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

#ifndef ENABLE_ADDITIONAL_CHECKS

      // if the value is available we don't need to recompute it
      if(m_nonbasicValueUpToDate)
         return m_nonbasicValue;

#endif

      if(rep() == COLUMN)
      {
         if(type() == LEAVE)
         {
            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theUCbound[i] * SPxLPBase<R>::upper(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::upper(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theLCbound[i] * SPxLPBase<R>::lower(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lower(i), SPxLPBase<R>::upper(i), this->epsilon()));
                  val += this->maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theLRbound[i] * SPxLPBase<R>::rhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theURbound[i] * SPxLPBase<R>::lhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lhs(i), SPxLPBase<R>::rhs(i), this->epsilon()));
                  val += this->maxRowObj(i) * SPxLPBase<R>::lhs(i);
                  break;

               default:
                  break;
               }
            }
         }
         else
         {
            assert(type() == ENTER);

            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxObj(i) * theUCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLCbound[i], theUCbound[i], this->epsilon()));
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxRowObj(i) * theLRbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLRbound[i], theURbound[i], this->epsilon()));
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               default:
                  break;
               }
            }
         }
      }
      else
      {
         assert(rep() == ROW);
         assert(type() == ENTER);

         for(i = this->nCols() - 1; i >= 0; --i)
         {
            switch(ds.colStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theUCbound[i] * this->lower(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLCbound[i] * this->upper(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLCbound[i] * this->upper(i);
               val += theUCbound[i] * this->lower(i);
               break;

            default:
               break;
            }
         }

         for(i = this->nRows() - 1; i >= 0; --i)
         {
            switch(ds.rowStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theURbound[i] * this->lhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLRbound[i] * this->rhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLRbound[i] * this->rhs(i);
               val += theURbound[i] * this->lhs(i);
               break;

            default:
               break;
            }
         }
      }

#ifdef ENABLE_ADDITIONAL_CHECKS

      if(m_nonbasicValueUpToDate && NE(m_nonbasicValue, val))
      {
         SPX_MSG_ERROR(std::cerr << "stored nonbasic value: " << m_nonbasicValue
                       << ", correct nonbasic value: " << val
                       << ", violation: " << val - m_nonbasicValue << std::endl;)
         assert(EQrel(m_nonbasicValue, val, 1e-12));
      }

#endif

      if(!m_nonbasicValueUpToDate)
      {
         m_nonbasicValue = R(val);
         m_nonbasicValueUpToDate = true;
      }

      return val;
   }